

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
Ser<AutoFile,std::vector<double,std::allocator<double>>>
          (VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *this,AutoFile *s,
          vector<double,_std::allocator<double>_> *v)

{
  long lVar1;
  bool bVar2;
  EncodedDoubleFormatter *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_FS_OFFSET;
  value_type_conflict7 *elem;
  vector<double,_std::allocator<double>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  EncodedDoubleFormatter formatter;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  AutoFile *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffffa8);
  WriteCompactSize<AutoFile>(in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<double,_std::allocator<double>_>::begin(in_RSI);
  std::vector<double,_std::allocator<double>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (AutoFile *)
         __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
         ::operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)in_stack_ffffffffffffffa8);
    anon_unknown.dwarf_1ebd1b3::EncodedDoubleFormatter::Ser<AutoFile>
              (in_RDX,in_stack_ffffffffffffffb8,(double)in_RSI);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }